

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void do_stack_frame(CPUM68KState_conflict *env,uint32_t *sp,uint16_t format,uint16_t sr,
                   uint32_t addr,uint32_t retaddr)

{
  int iVar1;
  CPUState *pCVar2;
  CPUState *cs;
  uint32_t retaddr_local;
  uint32_t addr_local;
  uint16_t sr_local;
  uint16_t format_local;
  uint32_t *sp_local;
  CPUM68KState_conflict *env_local;
  
  iVar1 = m68k_feature(env,0x12);
  if (iVar1 != 0) {
    pCVar2 = env_cpu(env);
    if (format - 2 < 2) {
      *sp = *sp - 4;
      cpu_stl_mmuidx_ra_m68k(env,*sp,addr,0,0);
    }
    else if (format == 4) {
      *sp = *sp - 4;
      cpu_stl_mmuidx_ra_m68k(env,*sp,env->pc,0,0);
      *sp = *sp - 4;
      cpu_stl_mmuidx_ra_m68k(env,*sp,addr,0,0);
    }
    *sp = *sp - 2;
    cpu_stw_mmuidx_ra_m68k(env,*sp,(uint)format * 0x1000 + pCVar2->exception_index * 4,0,0);
  }
  *sp = *sp - 4;
  cpu_stl_mmuidx_ra_m68k(env,*sp,retaddr,0,0);
  *sp = *sp - 2;
  cpu_stw_mmuidx_ra_m68k(env,*sp,(uint)sr,0,0);
  return;
}

Assistant:

static inline void do_stack_frame(CPUM68KState *env, uint32_t *sp,
                                  uint16_t format, uint16_t sr,
                                  uint32_t addr, uint32_t retaddr)
{
    if (m68k_feature(env, M68K_FEATURE_QUAD_MULDIV)) {
        /*  all except 68000 */
        CPUState *cs = env_cpu(env);
        switch (format) {
        case 4:
            *sp -= 4;
            cpu_stl_mmuidx_ra(env, *sp, env->pc, MMU_KERNEL_IDX, 0);
            *sp -= 4;
            cpu_stl_mmuidx_ra(env, *sp, addr, MMU_KERNEL_IDX, 0);
            break;
        case 3:
        case 2:
            *sp -= 4;
            cpu_stl_mmuidx_ra(env, *sp, addr, MMU_KERNEL_IDX, 0);
            break;
        }
        *sp -= 2;
        cpu_stw_mmuidx_ra(env, *sp, (format << 12) + (cs->exception_index << 2),
                          MMU_KERNEL_IDX, 0);
    }
    *sp -= 4;
    cpu_stl_mmuidx_ra(env, *sp, retaddr, MMU_KERNEL_IDX, 0);
    *sp -= 2;
    cpu_stw_mmuidx_ra(env, *sp, sr, MMU_KERNEL_IDX, 0);
}